

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::
WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>_>
::run(WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>_>
      *this,Module *module)

{
  PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
  *this_00;
  pointer puVar1;
  Global *pGVar2;
  pointer puVar3;
  Function *func;
  tuple<wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_> tVar4;
  undefined8 *puVar5;
  pointer puVar6;
  DataSegment *pDVar7;
  int iVar8;
  undefined8 *puVar9;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_2;
  __node_base_ptr p_Var10;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar11;
  pointer puVar12;
  pointer puVar13;
  PassOptions local_2b8;
  PassOptions local_210;
  undefined1 local_168 [8];
  PassRunner runner;
  _Head_base<0UL,_wasm::Pass_*,_false> local_38;
  
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    iVar8 = (*(this->super_Pass)._vptr_Pass[4])();
    if ((char)iVar8 == '\0') {
      this_00 = &this->
                 super_PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
      ;
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
      .currModule = module;
      puVar1 = (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar11 = (module->globals).
                     super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar1;
          puVar11 = puVar11 + 1) {
        pGVar2 = (puVar11->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if ((pGVar2->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
                 ,&pGVar2->init);
        }
      }
      puVar3 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar3;
          puVar12 = puVar12 + 1) {
        func = (puVar12->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
          (this->
          super_PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          ).
          super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          .currFunction = func;
          anon_unknown_99::CatchPopFixup::doWalkFunction((CatchPopFixup *)this,func);
          (this->
          super_PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          ).
          super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          .currFunction = (Function *)0x0;
        }
      }
      runner.skippedPasses._M_h._M_single_bucket =
           (__node_base_ptr)
           (module->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var10 = (__node_base_ptr)
                     (module->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          p_Var10 != runner.skippedPasses._M_h._M_single_bucket; p_Var10 = p_Var10 + 1) {
        tVar4.
        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             (((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                *)&p_Var10->_M_nxt)->
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             )._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
        ;
        if (*(long *)((long)tVar4.
                            super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                            .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                     0x20) != 0) {
          Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
                 ,(Expression **)
                  ((long)tVar4.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28))
          ;
        }
        puVar5 = *(undefined8 **)
                  ((long)tVar4.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40);
        for (puVar9 = *(undefined8 **)
                       ((long)tVar4.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                       0x38); puVar9 != puVar5; puVar9 = puVar9 + 1) {
          local_168 = (undefined1  [8])*puVar9;
          Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
                 ,(Expression **)local_168);
        }
      }
      puVar6 = (module->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar13 = (module->dataSegments).
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar6;
          puVar13 = puVar13 + 1) {
        pDVar7 = (puVar13->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar7->isPassive == false) {
          Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
          ::walk(&this_00->
                  super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
                 ,&pDVar7->offset);
        }
      }
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::CatchPopFixup,_wasm::Visitor<wasm::(anonymous_namespace)::CatchPopFixup,_void>_>
      .currModule = (Module *)0x0;
    }
    else {
      PassOptions::PassOptions(&local_2b8,&((this->super_Pass).runner)->options);
      local_2b8.optimizeLevel =
           ~-(uint)(local_2b8.optimizeLevel < 1) & 1 |
           local_2b8.optimizeLevel & -(uint)(local_2b8.optimizeLevel < 1);
      local_2b8.shrinkLevel =
           ~-(uint)(local_2b8.shrinkLevel < 1) & 1 |
           local_2b8.shrinkLevel & -(uint)(local_2b8.shrinkLevel < 1);
      PassOptions::PassOptions(&local_210,&local_2b8);
      PassRunner::PassRunner((PassRunner *)local_168,module,&local_210);
      PassOptions::~PassOptions(&local_210);
      runner.options.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_1_ = 1;
      (*(this->super_Pass)._vptr_Pass[5])(&local_38,this);
      PassRunner::add((PassRunner *)local_168,
                      (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&local_38);
      if (local_38._M_head_impl != (Pass *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Pass[1])();
      }
      local_38._M_head_impl = (Pass *)0x0;
      PassRunner::run((PassRunner *)local_168);
      PassRunner::~PassRunner((PassRunner *)local_168);
      PassOptions::~PassOptions(&local_2b8);
    }
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/pass.h"
                ,500,
                "virtual void wasm::WalkerPass<wasm::PostWalker<wasm::(anonymous namespace)::CatchPopFixup>>::run(Module *) [WalkerType = wasm::PostWalker<wasm::(anonymous namespace)::CatchPopFixup>]"
               );
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }